

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QSimplexConstraint_*>::growAppend
          (QCommonArrayOps<QSimplexConstraint_*> *this,QSimplexConstraint **b,QSimplexConstraint **e
          )

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<QSimplexConstraint_*> *old_00;
  QSimplexConstraint **in_RDX;
  QSimplexConstraint **in_RSI;
  QPodArrayOps<QSimplexConstraint_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QSimplexConstraint_*> *c;
  GrowthPosition where;
  QArrayDataPointer<QSimplexConstraint_*> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<QSimplexConstraint_*> *)((long)in_RDX - (long)in_RSI >> 3);
    c = (QCommonArrayOps<QSimplexConstraint_*> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<QSimplexConstraint_*> *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QSimplexConstraint_*>::QArrayDataPointer
              ((QArrayDataPointer<QSimplexConstraint_*> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QSimplexConstraint*>,QSimplexConstraint*const*>
                      ((QSimplexConstraint ***)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QSimplexConstraint_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QSimplexConstraint ***)in_RDX,old_00);
    }
    else {
      QArrayDataPointer<QSimplexConstraint_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QSimplexConstraint ***)in_RDX,old_00);
    }
    QPodArrayOps<QSimplexConstraint_*>::copyAppend(in_RDI,in_RDX,(QSimplexConstraint **)old_00);
    QArrayDataPointer<QSimplexConstraint_*>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }